

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmf(fitsfile *gfptr,char *xtension,char *extname,int extver,int position,char *location,
         long *member,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int in_ECX;
  int in_R8D;
  char *in_R9;
  long *in_stack_00000008;
  int *in_stack_00000010;
  char *tmpPtr [2];
  char nstr [1];
  char cwd [1025];
  char grpLocation2 [1025];
  char grpLocation1 [1025];
  char mbrLocation3 [1025];
  char mbrLocation2 [1025];
  char mbrLocation1 [1025];
  char tmpLocation [1025];
  char charBuff2 [1025];
  char charBuff1 [1025];
  long mextver;
  long nmembers;
  int i;
  int dummy;
  int grptype;
  int mposition;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  char *pcVar4;
  int *piVar5;
  char *in_stack_ffffffffffffdab8;
  int *in_stack_ffffffffffffdac8;
  char *in_stack_ffffffffffffdad0;
  undefined7 in_stack_ffffffffffffdad8;
  undefined1 in_stack_ffffffffffffdadf;
  undefined1 uVar6;
  size_t in_stack_ffffffffffffdae0;
  char *__src;
  fitsfile *fptr;
  undefined1 local_24f9;
  char local_24f8 [8];
  char **in_stack_ffffffffffffdb10;
  int *in_stack_ffffffffffffdb18;
  int *in_stack_ffffffffffffdb20;
  int *in_stack_ffffffffffffdb28;
  long *in_stack_ffffffffffffdb30;
  fitsfile *in_stack_ffffffffffffdb38;
  int *in_stack_ffffffffffffdb40;
  int *in_stack_ffffffffffffdb48;
  int *in_stack_ffffffffffffdb50;
  fitsfile *in_stack_ffffffffffffdb58;
  int *in_stack_ffffffffffffdb70;
  int *in_stack_ffffffffffffdb78;
  int *in_stack_ffffffffffffdb80;
  int *in_stack_ffffffffffffdea0;
  char *in_stack_ffffffffffffdea8;
  int *in_stack_ffffffffffffdeb0;
  char *in_stack_ffffffffffffdeb8;
  undefined4 in_stack_ffffffffffffdec0;
  int in_stack_ffffffffffffdec4;
  char *in_stack_ffffffffffffdec8;
  char *in_stack_ffffffffffffded0;
  char *in_stack_ffffffffffffded8;
  char local_20e8 [1040];
  char local_1cd8 [1040];
  char local_18c8 [1040];
  char local_14b8 [1040];
  char local_10a8 [952];
  int *in_stack_fffffffffffff310;
  char *in_stack_fffffffffffff318;
  char *in_stack_fffffffffffff320;
  char *in_stack_fffffffffffff328;
  char *in_stack_fffffffffffff330;
  fitsfile *in_stack_fffffffffffff338;
  int *in_stack_fffffffffffff350;
  char local_c98 [1040];
  fitsfile local_888 [65];
  char local_478 [1040];
  long local_68;
  long local_60;
  int local_58;
  char local_54 [4];
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  char *local_30;
  int local_28;
  int local_24;
  int local_4;
  
  local_4c = 0;
  local_60 = 0;
  local_68 = 0;
  local_30 = in_R9;
  local_28 = in_R8D;
  local_24 = in_ECX;
  memset(&local_24f9,0,1);
  if (*in_stack_00000010 == 0) {
    *in_stack_00000008 = 0;
    __src = local_478;
    fptr = local_888;
    if (*in_stack_00000010 == 0) {
      if (local_30 == (char *)0x0) {
        local_c98[0] = '\0';
      }
      else if (*local_30 == '\0') {
        local_c98[0] = '\0';
      }
      else {
        iVar1 = fits_is_url_absolute(in_stack_ffffffffffffdab8);
        if (iVar1 == 0) {
          fits_path2url(in_stack_ffffffffffffdec8,in_stack_ffffffffffffdec4,
                        in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
          if (local_c98[0] != '/') {
            fits_get_cwd(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
            in_stack_ffffffffffffdae0 = strlen(local_24f8);
            sVar2 = strlen(local_c98);
            if (0x400 < in_stack_ffffffffffffdae0 + sVar2 + 1) {
              ffpmsg((char *)0x1d7448);
              *in_stack_00000010 = 0x7d;
              return 0x7d;
            }
            strcat(local_24f8,"/");
            strcat(local_24f8,local_c98);
            fits_clean_url((char *)CONCAT17(in_stack_ffffffffffffdadf,in_stack_ffffffffffffdad8),
                           in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8);
          }
        }
        else {
          strcpy(local_c98,local_30);
        }
      }
      iVar1 = ffgtgc(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,
                     in_stack_ffffffffffffdb40,&in_stack_ffffffffffffdb38->HDUposition,
                     (int *)in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb70,
                     in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb80);
      *in_stack_00000010 = iVar1;
      iVar1 = ffgtnm(in_stack_ffffffffffffdb38,in_stack_ffffffffffffdb30,in_stack_ffffffffffffdb28);
      *in_stack_00000010 = iVar1;
      local_58 = 1;
      while( true ) {
        uVar6 = false;
        if ((local_58 <= local_60) && (uVar6 = false, *in_stack_00000008 == 0)) {
          uVar6 = *in_stack_00000010 == 0;
        }
        if ((bool)uVar6 == false) break;
        if (local_34 == 0) {
LAB_001d7619:
          if (local_38 != 0) {
            pcVar4 = local_54;
            piVar5 = in_stack_00000010;
            ffgcvs(fptr,(int)((ulong)__src >> 0x20),in_stack_ffffffffffffdae0,
                   CONCAT17(uVar6,in_stack_ffffffffffffdad8),(LONGLONG)in_stack_ffffffffffffdad0,
                   (char *)in_stack_ffffffffffffdac8,in_stack_ffffffffffffdb10,
                   in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20);
            iVar1 = fits_strcasecmp((char *)piVar5,pcVar4);
            if (iVar1 != 0) goto LAB_001d7da1;
          }
          if (((local_3c == 0) ||
              (ffgcvj(fptr,(int)((ulong)__src >> 0x20),in_stack_ffffffffffffdae0,
                      CONCAT17(uVar6,in_stack_ffffffffffffdad8),(LONGLONG)in_stack_ffffffffffffdad0,
                      (long)in_stack_ffffffffffffdac8,(long *)in_stack_ffffffffffffdb10,
                      in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20), local_24 == local_68))
             && ((local_40 == 0 ||
                 (((local_50 != 2 && (local_50 != 0xc)) ||
                  (ffgcvk(fptr,(int)((ulong)__src >> 0x20),in_stack_ffffffffffffdae0,
                          CONCAT17(uVar6,in_stack_ffffffffffffdad8),
                          (LONGLONG)in_stack_ffffffffffffdad0,
                          (int)((ulong)in_stack_ffffffffffffdac8 >> 0x20),
                          (int *)in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb18,
                          in_stack_ffffffffffffdb20), local_28 == local_4c)))))) {
            if (local_30 == (char *)0x0) {
              ffpmsg((char *)0x1d779b);
              *in_stack_00000008 = (long)local_58;
            }
            else {
              if (local_44 == 0) {
                local_10a8[0] = '\0';
              }
              else {
                ffgcvs(fptr,(int)((ulong)__src >> 0x20),in_stack_ffffffffffffdae0,
                       CONCAT17(uVar6,in_stack_ffffffffffffdad8),(LONGLONG)in_stack_ffffffffffffdad0
                       ,(char *)in_stack_ffffffffffffdac8,in_stack_ffffffffffffdb10,
                       in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20);
                strcpy(local_10a8,__src);
                local_14b8[0] = '\0';
              }
              if (local_10a8[0] == '\0') {
                iVar1 = fits_get_url(in_stack_fffffffffffff338,in_stack_fffffffffffff330,
                                     in_stack_fffffffffffff328,in_stack_fffffffffffff320,
                                     in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                                     in_stack_fffffffffffff350);
                *in_stack_00000010 = iVar1;
                if (((local_10a8[0] != '\0') &&
                    (iVar1 = fits_is_url_absolute(in_stack_ffffffffffffdab8), iVar1 == 0)) &&
                   (local_10a8[0] != '/')) {
                  fits_get_cwd(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
                  in_stack_ffffffffffffdad0 = (char *)strlen(local_24f8);
                  sVar2 = strlen(local_10a8);
                  if ((char *)0x400 < in_stack_ffffffffffffdad0 + sVar2 + 1) {
                    ffpmsg((char *)0x1d7908);
                    *in_stack_00000010 = 0x7d;
                    goto LAB_001d7da1;
                  }
                  strcat(local_24f8,"/");
                  strcat(local_24f8,local_10a8);
                  fits_clean_url((char *)CONCAT17(uVar6,in_stack_ffffffffffffdad8),
                                 in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8);
                }
                if (((local_14b8[0] != '\0') &&
                    (iVar1 = fits_is_url_absolute(in_stack_ffffffffffffdab8), iVar1 == 0)) &&
                   (local_14b8[0] != '/')) {
                  fits_get_cwd(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
                  in_stack_ffffffffffffdac8 = (int *)strlen(local_24f8);
                  sVar2 = strlen(local_14b8);
                  if (0x400 < (long)in_stack_ffffffffffffdac8 + sVar2 + 1) {
                    ffpmsg((char *)0x1d79e1);
                    *in_stack_00000010 = 0x7d;
                    goto LAB_001d7da1;
                  }
                  strcat(local_24f8,"/");
                  strcat(local_24f8,local_14b8);
                  fits_clean_url((char *)CONCAT17(uVar6,in_stack_ffffffffffffdad8),
                                 in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8);
                }
              }
              else {
                iVar1 = fits_is_url_absolute(in_stack_ffffffffffffdab8);
                if ((iVar1 == 0) && (local_10a8[0] != '/')) {
                  strcpy(local_14b8,local_10a8);
                  iVar1 = fits_get_url(in_stack_fffffffffffff338,in_stack_fffffffffffff330,
                                       in_stack_fffffffffffff328,in_stack_fffffffffffff320,
                                       in_stack_fffffffffffff318,in_stack_fffffffffffff310,
                                       in_stack_fffffffffffff350);
                  *in_stack_00000010 = iVar1;
                  if (local_1cd8[0] == '\0') {
                    local_10a8[0] = '\0';
                  }
                  else {
                    iVar1 = fits_is_url_absolute(in_stack_ffffffffffffdab8);
                    if ((iVar1 == 0) && (local_1cd8[0] != '/')) {
                      fits_get_cwd(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
                      sVar2 = strlen(local_24f8);
                      sVar3 = strlen(local_1cd8);
                      if (0x400 < sVar2 + sVar3 + 1) {
                        ffpmsg((char *)0x1d7b3b);
                        *in_stack_00000010 = 0x7d;
                        goto LAB_001d7da1;
                      }
                      strcat(local_24f8,"/");
                      strcat(local_24f8,local_1cd8);
                      fits_clean_url((char *)CONCAT17(uVar6,in_stack_ffffffffffffdad8),
                                     in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8);
                    }
                    fits_relurl2url(in_stack_ffffffffffffded8,in_stack_ffffffffffffded0,
                                    in_stack_ffffffffffffdec8,
                                    (int *)CONCAT44(in_stack_ffffffffffffdec4,
                                                    in_stack_ffffffffffffdec0));
                    if (*in_stack_00000010 == 0) {
                      strcpy(local_10a8,local_18c8);
                    }
                    else if (*in_stack_00000010 == 0x7d) {
                      *in_stack_00000010 = 0;
                      local_10a8[0] = '\0';
                    }
                  }
                  if (local_20e8[0] == '\0') {
                    local_14b8[0] = '\0';
                  }
                  else {
                    iVar1 = fits_is_url_absolute(in_stack_ffffffffffffdab8);
                    if ((iVar1 == 0) && (local_20e8[0] != '/')) {
                      fits_get_cwd(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
                      in_stack_ffffffffffffdab8 = (char *)strlen(local_24f8);
                      sVar2 = strlen(local_20e8);
                      if ((char *)0x400 < in_stack_ffffffffffffdab8 + sVar2 + 1) {
                        ffpmsg((char *)0x1d7c8c);
                        *in_stack_00000010 = 0x7d;
                        goto LAB_001d7da1;
                      }
                      strcat(local_24f8,"/");
                      strcat(local_24f8,local_20e8);
                      fits_clean_url((char *)CONCAT17(uVar6,in_stack_ffffffffffffdad8),
                                     in_stack_ffffffffffffdad0,in_stack_ffffffffffffdac8);
                    }
                    fits_relurl2url(in_stack_ffffffffffffded8,in_stack_ffffffffffffded0,
                                    in_stack_ffffffffffffdec8,
                                    (int *)CONCAT44(in_stack_ffffffffffffdec4,
                                                    in_stack_ffffffffffffdec0));
                    if (*in_stack_00000010 == 0) {
                      strcpy(local_14b8,local_18c8);
                    }
                    else if (*in_stack_00000010 == 0x7d) {
                      *in_stack_00000010 = 0;
                      local_14b8[0] = '\0';
                    }
                  }
                }
              }
              iVar1 = strcmp(local_10a8,local_c98);
              if ((iVar1 == 0) || (iVar1 = strcmp(local_14b8,local_c98), iVar1 == 0)) {
                *in_stack_00000008 = (long)local_58;
              }
            }
          }
        }
        else {
          pcVar4 = local_54;
          piVar5 = in_stack_00000010;
          ffgcvs(fptr,(int)((ulong)__src >> 0x20),in_stack_ffffffffffffdae0,
                 CONCAT17(uVar6,in_stack_ffffffffffffdad8),(LONGLONG)in_stack_ffffffffffffdad0,
                 (char *)in_stack_ffffffffffffdac8,in_stack_ffffffffffffdb10,
                 in_stack_ffffffffffffdb18,in_stack_ffffffffffffdb20);
          iVar1 = fits_strcasecmp((char *)piVar5,pcVar4);
          if (iVar1 == 0) goto LAB_001d7619;
        }
LAB_001d7da1:
        local_58 = local_58 + 1;
      }
      if ((*in_stack_00000008 == 0) && (*in_stack_00000010 == 0)) {
        *in_stack_00000010 = 0x156;
        ffpmsg((char *)0x1d7dec);
      }
      local_4 = *in_stack_00000010;
    }
    else {
      local_4 = *in_stack_00000010;
    }
  }
  else {
    local_4 = *in_stack_00000010;
  }
  return local_4;
}

Assistant:

int ffgmf(fitsfile *gfptr, /* pointer to grouping table HDU to search       */
	   char *xtension,  /* XTENSION value for member HDU                */
	   char *extname,   /* EXTNAME value for member HDU                 */
	   int   extver,    /* EXTVER value for member HDU                  */
	   int   position,  /* HDU position value for member HDU            */
	   char *location,  /* FITS file location value for member HDU      */
	   long *member,    /* member HDU ID within group table (if found)  */
	   int  *status)    /* return status code                           */

/*
   try to find the entry for the member HDU defined by the xtension, extname,
   extver, position, and location parameters within the grouping table
   pointed to by gfptr. If the member HDU is found then its ID (row number)
   within the grouping table is returned in the member variable; if not
   found then member is returned with a value of 0 and the status return
   code will be set to MEMBER_NOT_FOUND.

   Note that the member HDU postion information is used to obtain a member
   match only if the grouping table type is GT_ID_POS_URI or GT_ID_POS. This
   is because the position information can become invalid much more
   easily then the reference information for a group member.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int mposition = 0;
  int grptype;
  int dummy;
  int i;

  long nmembers = 0;
  long mextver  = 0;
 
  char  charBuff1[FLEN_FILENAME];
  char  charBuff2[FLEN_FILENAME];
  char  tmpLocation[FLEN_FILENAME];
  char  mbrLocation1[FLEN_FILENAME];
  char  mbrLocation2[FLEN_FILENAME];
  char  mbrLocation3[FLEN_FILENAME];
  char  grpLocation1[FLEN_FILENAME];
  char  grpLocation2[FLEN_FILENAME];
  char  cwd[FLEN_FILENAME];

  char  nstr[] = {'\0'};
  char *tmpPtr[2];

  if(*status != 0) return(*status);

  *member = 0;

  tmpPtr[0] = charBuff1;
  tmpPtr[1] = charBuff2;


  if(*status != 0) return(*status);

  /*
    if the passed LOCATION value is not an absolute URL then turn it
    into an absolute path
  */

  if(location == NULL)
    {
      *tmpLocation = 0;
    }

  else if(*location == 0)
    {
      *tmpLocation = 0;
    }

  else if(!fits_is_url_absolute(location))
    {
      fits_path2url(location,FLEN_FILENAME,tmpLocation,status);

      if(*tmpLocation != '/')
	{
	  fits_get_cwd(cwd,status);
          if (strlen(cwd)+strlen(tmpLocation)+1 > 
                    FLEN_FILENAME-1)
          {
             ffpmsg("cwd and location are too long (ffgmf)");
             return (*status = URL_PARSE_ERROR);
          }
	  strcat(cwd,"/");
	  strcat(cwd,tmpLocation);
	  fits_clean_url(cwd,tmpLocation,status);
	}
    }

  else
    strcpy(tmpLocation,location);

  /*
     retrieve the Grouping Convention reserved column positions within
     the grouping table
  */

  *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		   &locationCol,&uriCol,&grptype,status);

  /* retrieve the number of group members */

  *status = fits_get_num_members(gfptr,&nmembers,status);
	      
  /* 
     loop over all grouping table rows until the member HDU is found 
  */

  for(i = 1; i <= nmembers && *member == 0 && *status == 0; ++i)
    {
      if(xtensionCol != 0)
	{
	  fits_read_col_str(gfptr,xtensionCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  if(fits_strcasecmp(tmpPtr[0],xtension) != 0) continue;
	}
	  
      if(extnameCol  != 0)
	{
	  fits_read_col_str(gfptr,extnameCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  if(fits_strcasecmp(tmpPtr[0],extname) != 0) continue;
	}
	  
      if(extverCol   != 0)
	{
	  fits_read_col_lng(gfptr,extverCol,i,1,1,0,
			    (long*)&mextver,&dummy,status);
	  if(extver != mextver) continue;
	}
      
      /* note we only use postionCol if we have to */

      if(positionCol != 0 && 
	            (grptype == GT_ID_POS || grptype == GT_ID_POS_URI))
	{
	  fits_read_col_int(gfptr,positionCol,i,1,1,0,
			    &mposition,&dummy,status);
	  if(position != mposition) continue;
	}
      
      /*
	if no location string was passed to the function then assume that
	the calling application does not wish to use it as a comparision
	critera ==> if we got this far then we have a match
      */

      if(location == NULL)
	{
	  ffpmsg("NULL Location string given ==> ignore location (ffgmf)");
	  *member = i;
	  continue;
	}

      /*
	if the grouping table MEMBER_LOCATION column exists then read the
	location URL for the member, else set the location string to
	a zero-length string for subsequent comparisions
      */

      if(locationCol != 0)
	{
	  fits_read_col_str(gfptr,locationCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  strcpy(mbrLocation1,tmpPtr[0]);
	  *mbrLocation2 = 0;
	}
      else
	*mbrLocation1 = 0;

      /* 
	 if the member location string from the grouping table is zero 
	 length (either implicitly or explicitly) then assume that the 
	 member HDU is in the same file as the grouping table HDU; retrieve
	 the possible URL values of the grouping table HDU file 
       */

      if(*mbrLocation1 == 0)
	{
	  /* retrieve the possible URLs of the grouping table file */
	  *status = fits_get_url(gfptr,mbrLocation1,mbrLocation2,NULL,NULL,
				 NULL,status);

	  /* if non-NULL, make sure the first URL is absolute or a full path */
	  if(*mbrLocation1 != 0 && !fits_is_url_absolute(mbrLocation1) &&
	     *mbrLocation1 != '/')
	    {
	      fits_get_cwd(cwd,status);
              if (strlen(cwd)+strlen(mbrLocation1)+1 > 
                        FLEN_FILENAME-1)
              {
                 ffpmsg("cwd and member locations are too long (ffgmf)");
                 *status = URL_PARSE_ERROR;
                 continue;
              }
	      strcat(cwd,"/");
	      strcat(cwd,mbrLocation1);
	      fits_clean_url(cwd,mbrLocation1,status);
	    }

	  /* if non-NULL, make sure the first URL is absolute or a full path */
	  if(*mbrLocation2 != 0 && !fits_is_url_absolute(mbrLocation2) &&
	     *mbrLocation2 != '/')
	    {
	      fits_get_cwd(cwd,status);
              if (strlen(cwd)+strlen(mbrLocation2)+1 > 
                        FLEN_FILENAME-1)
              {
                 ffpmsg("cwd and member locations are too long (ffgmf)");
                 *status = URL_PARSE_ERROR;
                 continue;
              }
	      strcat(cwd,"/");
	      strcat(cwd,mbrLocation2);
	      fits_clean_url(cwd,mbrLocation2,status);
	    }
	}

      /*
	if the member location was specified, then make sure that it is
	either an absolute URL or specifies a full path
      */

      else if(!fits_is_url_absolute(mbrLocation1) && *mbrLocation1 != '/')
	{
	  strcpy(mbrLocation2,mbrLocation1);

	  /* get the possible URLs for the grouping table file */
	  *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,NULL,
				 NULL,status);
	  
	  if(*grpLocation1 != 0)
	    {
	      /* make sure the first grouping table URL is absolute */
	      if(!fits_is_url_absolute(grpLocation1) && *grpLocation1 != '/')
		{
		  fits_get_cwd(cwd,status);
                  if (strlen(cwd)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("cwd and group locations are too long (ffgmf)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(cwd,"/");
		  strcat(cwd,grpLocation1);
		  fits_clean_url(cwd,grpLocation1,status);
		}
	      
	      /* create an absoute URL for the member */

	      fits_relurl2url(grpLocation1,mbrLocation1,mbrLocation3,status);
	      
	      /* 
		 if URL construction succeeded then copy it to the
		 first location string; else set the location string to 
		 empty
	      */

	      if(*status == 0)
		{
		  strcpy(mbrLocation1,mbrLocation3);
		}

	      else if(*status == URL_PARSE_ERROR)
		{
		  *status       = 0;
		  *mbrLocation1 = 0;
		}
	    }
	  else
	    *mbrLocation1 = 0;

	  if(*grpLocation2 != 0)
	    {
	      /* make sure the second grouping table URL is absolute */
	      if(!fits_is_url_absolute(grpLocation2) && *grpLocation2 != '/')
		{
		  fits_get_cwd(cwd,status);
                  if (strlen(cwd)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("cwd and group locations are too long (ffgmf)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(cwd,"/");
		  strcat(cwd,grpLocation2);
		  fits_clean_url(cwd,grpLocation2,status);
		}
	      
	      /* create an absolute URL for the member */

	      fits_relurl2url(grpLocation2,mbrLocation2,mbrLocation3,status);
	      
	      /* 
		 if URL construction succeeded then copy it to the
		 second location string; else set the location string to 
		 empty
	      */

	      if(*status == 0)
		{
		  strcpy(mbrLocation2,mbrLocation3);
		}

	      else if(*status == URL_PARSE_ERROR)
		{
		  *status       = 0;
		  *mbrLocation2 = 0;
		}
	    }
	  else
	    *mbrLocation2 = 0;
	}

      /*
	compare the passed member HDU file location string with the
	(possibly two) member location strings to see if there is a match
       */

      if(strcmp(mbrLocation1,tmpLocation) != 0 && 
	 strcmp(mbrLocation2,tmpLocation) != 0   ) continue;
  
      /* if we made it this far then a match to the member HDU was found */
      
      *member = i;
    }

  /* if a match was not found then set the return status code */

  if(*member == 0 && *status == 0) 
    {
      *status = MEMBER_NOT_FOUND;
      ffpmsg("Cannot find specified member HDU (ffgmf)");
    }

  return(*status);
}